

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O2

bool qt_try_modal(QWidget *widget,Type type)

{
  bool bVar1;
  bool bVar2;
  int __sig;
  long in_FS_OFFSET;
  QWidget *top;
  QWidget *local_18;
  long local_10;
  
  __sig = (int)&local_18;
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = (QWidget *)0x0;
  bVar1 = QApplicationPrivate::tryModalHelper(widget,&local_18);
  bVar2 = true;
  if (((!bVar1) && (type < FocusIn)) && ((0xecU >> (type & Wheel) & 1) != 0)) {
    if ((local_18 != (QWidget *)0x0) && (*(long *)(*(long *)&local_18->field_0x8 + 0x10) == 0)) {
      QWidget::raise(local_18,__sig);
    }
    bVar2 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool qt_try_modal(QWidget *widget, QEvent::Type type)
{
    QWidget * top = nullptr;

    if (QApplicationPrivate::tryModalHelper(widget, &top))
        return true;

    bool block_event  = false;

    switch (type) {
    case QEvent::MouseButtonPress:                        // disallow mouse/key events
    case QEvent::MouseButtonRelease:
    case QEvent::MouseMove:
    case QEvent::KeyPress:
    case QEvent::KeyRelease:
        block_event         = true;
        break;
    default:
        break;
    }

    if (block_event && top && top->parentWidget() == nullptr)
        top->raise();

    return !block_event;
}